

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Cluster * __thiscall mkvparser::Segment::FindOrPreloadCluster(Segment *this,longlong requested_pos)

{
  Cluster **ppCVar1;
  bool bVar2;
  Cluster **ppCVar3;
  Cluster *pCVar4;
  long lVar5;
  Cluster **ppCVar6;
  
  if (-1 < requested_pos) {
    ppCVar6 = this->m_clusters;
    ppCVar3 = ppCVar6 + this->m_clusterCount + this->m_clusterPreloadCount;
    if (ppCVar6 < ppCVar3) {
      do {
        ppCVar1 = (Cluster **)
                  ((long)ppCVar6 +
                  (((long)ppCVar3 - (long)ppCVar6 >> 3) - ((long)ppCVar3 - (long)ppCVar6 >> 0x3f) &
                  0xfffffffffffffffeU) * 4);
        pCVar4 = *ppCVar1;
        lVar5 = pCVar4->m_element_start - pCVar4->m_pSegment->m_start;
        if (lVar5 < requested_pos) {
          ppCVar6 = ppCVar1 + 1;
        }
        else {
          ppCVar3 = ppCVar1;
          if (lVar5 <= requested_pos) {
            return pCVar4;
          }
        }
      } while (ppCVar6 < ppCVar3);
    }
    pCVar4 = Cluster::Create(this,-1,requested_pos);
    if (pCVar4 != (Cluster *)0x0) {
      bVar2 = PreloadCluster(this,pCVar4,(long)ppCVar6 - (long)this->m_clusters >> 3);
      if (bVar2) {
        return pCVar4;
      }
      Cluster::~Cluster(pCVar4);
      operator_delete(pCVar4);
    }
  }
  return (Cluster *)0x0;
}

Assistant:

const Cluster* Segment::FindOrPreloadCluster(long long requested_pos) {
  if (requested_pos < 0)
    return 0;

  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < requested_pos)
      i = k + 1;
    else if (pos > requested_pos)
      j = k;
    else
      return pCluster;
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, requested_pos);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster;
}